

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

vector<Vec2,_std::allocator<Vec2>_> * __thiscall
Router::Route(vector<Vec2,_std::allocator<Vec2>_> *__return_storage_ptr__,Router *this,Vec2 start,
             Vec2 end)

{
  pointer *ppVVar1;
  iterator iVar2;
  pointer pVVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  undefined7 uVar15;
  ulong uVar13;
  undefined8 *puVar14;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  float *pfVar21;
  float fVar22;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar23;
  bool used [100];
  float dis [100];
  Vec2 vertex [100];
  int prev [100];
  float edges [100] [100];
  Vec2 local_a398;
  uint local_a38c;
  vector<Vec2,std::allocator<Vec2>> *local_a388;
  ulong local_a380;
  undefined1 local_a378 [24];
  long local_a360;
  ulong local_a358;
  ulong local_a350;
  ulong local_a348;
  ulong local_a340;
  float *local_a338;
  ulong local_a330;
  char acStack_a328 [112];
  float afStack_a2b8 [100];
  Vec2 local_a128 [100];
  uint local_9e08 [100];
  float local_9c78 [10002];
  
  local_a378._8_4_ = in_XMM0_Dc;
  local_a378._0_8_ = start;
  local_a378._12_4_ = in_XMM0_Dd;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a398 = end;
  bVar8 = Reachable(this,end);
  if (bVar8) {
    fVar22 = (local_a398.x - (float)local_a378._0_4_) * (local_a398.x - (float)local_a378._0_4_) +
             (local_a398.y - (float)local_a378._4_4_) * (local_a398.y - (float)local_a378._4_4_);
    if (fVar22 < 0.0) {
      fVar22 = sqrtf(fVar22);
    }
    else {
      fVar22 = SQRT(fVar22);
    }
    if (0.0001 <= fVar22) {
      iVar9 = this->VertexCount;
      lVar16 = (long)iVar9;
      local_a388 = (vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__;
      memset(local_a128,0,800);
      auVar7 = local_a378._0_16_;
      if (0 < lVar16) {
        pVVar3 = (this->Vertexes).super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = 0;
        do {
          local_a128[lVar11] = pVVar3[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar16 != lVar11);
      }
      local_a128[lVar16].x = (float)local_a378._0_4_;
      local_a128[lVar16].y = (float)local_a378._4_4_;
      local_a38c = iVar9 + 2;
      local_a128[lVar16 + 1] = local_a398;
      local_a378._0_16_ = auVar7;
      local_a360 = lVar16;
      if (-2 < iVar9) {
        uVar12 = (ulong)(int)local_a38c;
        local_a358 = 1;
        if (1 < (int)local_a38c) {
          local_a358 = (ulong)local_a38c;
        }
        uVar13 = (ulong)local_a38c;
        local_a380 = 1;
        uVar18 = 0;
        local_a350 = uVar12;
        local_a340 = uVar13;
        do {
          local_9e08[uVar18] = 0xffffffff;
          acStack_a328[uVar18] = '\0';
          fVar22 = 0.0;
          if (uVar18 != (uint)this->VertexCount) {
            fVar22 = 1e+08;
          }
          afStack_a2b8[uVar18] = fVar22;
          pfVar21 = local_9c78 + uVar18 * 100;
          pfVar21[uVar18] = 0.0;
          local_a348 = uVar18 + 1;
          if ((long)local_a348 < (long)local_a350) {
            local_a330 = uVar18 * 3;
            uVar19 = local_a380;
            local_a338 = pfVar21;
            do {
              lVar16 = (long)this->VertexCount;
              uVar15 = (undefined7)(uVar12 >> 8);
              uVar12 = CONCAT71(uVar15,(long)uVar18 < lVar16);
              if ((long)uVar18 < lVar16 && (long)uVar19 < lVar16) {
                fVar22 = *(float *)(*(long *)((long)&(((this->Edges).
                                                                                                              
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data + local_a330 * 8)
                                   + uVar19 * 4);
                uVar12 = local_a330;
              }
              else {
                if (0 < this->ObstacleCount) {
                  uVar12 = CONCAT71(uVar15,1);
                  lVar16 = 0;
                  do {
                    local_a378._0_4_ = (int)uVar12;
                    lVar11 = 1;
                    do {
                      if (lVar11 == 5) {
                        uVar12 = (ulong)(uint)local_a378._0_4_;
                        goto LAB_00106916;
                      }
                      lVar4 = *(long *)&(this->Obstacles).
                                        super__Vector_base<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                        super__Vector_base<Vec2,_std::allocator<Vec2>_>._M_impl.
                                        super__Vector_impl_data;
                      bVar8 = intersect(local_a128[uVar18],local_a128[uVar19],
                                        *(Vec2 *)(lVar4 + -8 + lVar11 * 8),
                                        *(Vec2 *)(lVar4 + (ulong)((uint)lVar11 & 3) * 8));
                      lVar11 = lVar11 + 1;
                    } while (!bVar8);
                    uVar12 = 0;
LAB_00106916:
                  } while (((uVar12 & 1) != 0) &&
                          (lVar16 = lVar16 + 1, lVar16 < this->ObstacleCount));
                  fVar22 = 1e+08;
                  uVar13 = local_a340;
                  pfVar21 = local_a338;
                  if ((uVar12 & 1) == 0) goto LAB_00106985;
                }
                fVar22 = local_a128[uVar18].x - local_a128[uVar19].x;
                fVar23 = local_a128[uVar18].y - local_a128[uVar19].y;
                fVar22 = fVar22 * fVar22 + fVar23 * fVar23;
                if (fVar22 < 0.0) {
                  fVar22 = sqrtf(fVar22);
                }
                else {
                  fVar22 = SQRT(fVar22);
                }
              }
LAB_00106985:
              local_9c78[uVar19 * 100 + uVar18] = fVar22;
              pfVar21[uVar19] = fVar22;
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar13);
          }
          local_a380 = local_a380 + 1;
          uVar18 = local_a348;
        } while (local_a348 != local_a358);
      }
      __return_storage_ptr__ = (vector<Vec2,_std::allocator<Vec2>_> *)local_a388;
      uVar12 = local_a360 + 1;
      uVar13 = 1;
      if (1 < (int)local_a38c) {
        uVar13 = (ulong)local_a38c;
      }
      do {
        uVar17 = 0xffffffff;
        uVar20 = (uint)local_a360;
        if (-2 < (int)uVar20) {
          uVar18 = 0;
          do {
            if ((acStack_a328[uVar18] == '\0') &&
               ((uVar17 == 0xffffffff ||
                (afStack_a2b8[uVar18] <= afStack_a2b8[(int)uVar17] &&
                 afStack_a2b8[(int)uVar17] != afStack_a2b8[uVar18])))) {
              uVar17 = (uint)uVar18;
            }
            uVar18 = uVar18 + 1;
          } while (uVar13 != uVar18);
        }
        if (uVar17 == 0xffffffff) break;
        lVar16 = (long)(int)uVar17;
        acStack_a328[lVar16] = '\x01';
        if (-2 < (int)uVar20) {
          uVar18 = 0;
          do {
            if (afStack_a2b8[lVar16] + local_9c78[lVar16 * 100 + uVar18] < afStack_a2b8[uVar18]) {
              afStack_a2b8[uVar18] = afStack_a2b8[lVar16] + local_9c78[lVar16 * 100 + uVar18];
              local_9e08[uVar18] = uVar17;
            }
            uVar18 = uVar18 + 1;
          } while (uVar13 != uVar18);
        }
      } while (uVar17 != 0xffffffff);
      do {
        iVar9 = (int)uVar12;
        iVar2._M_current = *(Vec2 **)((long)__return_storage_ptr__ + 8);
        if (iVar2._M_current == *(Vec2 **)((long)__return_storage_ptr__ + 0x10)) {
          std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                    ((vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__,iVar2,
                     local_a128 + iVar9);
        }
        else {
          *iVar2._M_current = local_a128[iVar9];
          *(long *)((long)__return_storage_ptr__ + 8) =
               *(long *)((long)__return_storage_ptr__ + 8) + 8;
        }
        uVar12 = (ulong)local_9e08[iVar9];
      } while (local_9e08[iVar9] != uVar20);
      puVar5 = *(undefined8 **)__return_storage_ptr__;
      puVar14 = *(undefined8 **)((long)__return_storage_ptr__ + 8) + -1;
      if (puVar5 < puVar14 && puVar5 != *(undefined8 **)((long)__return_storage_ptr__ + 8)) {
        do {
          puVar10 = puVar5 + 1;
          uVar6 = *puVar5;
          *puVar5 = *puVar14;
          *puVar14 = uVar6;
          puVar14 = puVar14 + -1;
          puVar5 = puVar10;
        } while (puVar10 < puVar14);
      }
    }
    else {
      iVar2._M_current =
           (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vec2,std::allocator<Vec2>>::_M_realloc_insert<Vec2_const&>
                  ((vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__,iVar2,&local_a398);
      }
      else {
        *iVar2._M_current = local_a398;
        ppVVar1 = &(__return_storage_ptr__->super__Vector_base<Vec2,_std::allocator<Vec2>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
    }
  }
  return (vector<Vec2,_std::allocator<Vec2>_> *)
         (vector<Vec2,std::allocator<Vec2>> *)__return_storage_ptr__;
}

Assistant:

std::vector<Vec2> Router::Route(Vec2 start, Vec2 end)
{
    std::vector<Vec2> res;
    if (!Reachable(end))
        return res;
    if ((end - start).length() < EPS)
    {
        res.push_back(end);
        return res;
    }

    int Points = VertexCount;

    float dis[MAX_POINTS];					//起点到该点的最短距离
	float edges[MAX_POINTS][MAX_POINTS];    //边权
	Vec2 vertex[MAX_POINTS];			    //参与最短路计算的点的坐标
	int prev[MAX_POINTS];					//点的前驱，回溯最短路用
	bool used[MAX_POINTS];                  //点是否已松弛过

    for (int i = 0; i < Points; ++i)
        vertex[i] = Vertexes[i];
    vertex[Points++] = start;
    vertex[Points++] = end;

    for (int i = 0; i < Points; ++i)
    {
        prev[i] = -1;
        used[i] = false;
        dis[i] = (i == VertexCount ? 0 : FINF);
        edges[i][i] = 0;
        for (int j = i + 1; j < Points; ++j)
        {
            if (i < VertexCount && j < VertexCount)
            {
                edges[i][j] = edges[j][i] = Edges[i][j];
                continue;
            }
            bool flag = true;
            for (int u = 0; u < ObstacleCount; ++u)
            {
                for (int v = 0; v < 4; ++v)
                    if (intersect(vertex[i], vertex[j], Obstacles[u][v], Obstacles[u][(v + 1) & 3]))
                    {
						flag = false;
                        break;
                    }
                if (!flag)
                    break;
            }
            edges[i][j] = edges[j][i] = (flag ? (vertex[i] - vertex[j]).length() : FINF);
        }
    }

    //Dijkstra
    while (true)
    {
        int v = -1;
        for (int i = 0; i < Points; ++i)
            if (!used[i] && (v == -1 || dis[i] < dis[v]))
                v = i;
		if (v == -1)
            break;
        used[v] = true;
        for (int i = 0; i < Points; ++i)
            if (dis[i] > dis[v] + edges[v][i])
            {
                dis[i] = dis[v] + edges[v][i];
                prev[i] = v;
            }
    }

	for (int i = Points - 1; i != Points - 2; i = prev[i])
        res.push_back(vertex[i]);
    reverse(res.begin(), res.end());
    return res;
}